

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfscursor.cpp
# Opt level: O0

void __thiscall QEglFSCursor::update(QEglFSCursor *this,QRect *rect,bool allScreens)

{
  byte bVar1;
  QEvent *pQVar2;
  byte in_DL;
  CursorUpdateEvent *in_RSI;
  QRect *in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_DL & 1;
  if ((in_RDI[0xe].x2.m_i & 1) == 0) {
    *(undefined1 *)&in_RDI[0xe].x2.m_i = 1;
    pQVar2 = (QEvent *)operator_new(0x30);
    CursorUpdateEvent::CursorUpdateEvent
              (in_RSI,(QPoint *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),in_RDI,
               SUB81((ulong)pQVar2 >> 0x38,0));
    QCoreApplication::postEvent((QObject *)in_RDI,pQVar2,0);
  }
  return;
}

Assistant:

void QEglFSCursor::update(const QRect &rect, bool allScreens)
{
    if (!m_updateRequested) {
        // Must not flush the window system events directly from here since we are likely to
        // be a called directly from QGuiApplication's processMouseEvents. Flushing events
        // could cause reentering by dispatching more queued mouse events.
        m_updateRequested = true;
        QCoreApplication::postEvent(this, new CursorUpdateEvent(m_cursor.pos, rect, allScreens));
    }
}